

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_class_magic(parser *p)

{
  parser_error pVar1;
  uint uVar2;
  wchar_t wVar3;
  void *pvVar4;
  void *pvVar5;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pVar1 = PARSE_ERROR_REPEATED_DIRECTIVE;
    if (*(long *)((long)pvVar4 + 0x110) == 0) {
      uVar2 = parser_getuint(p,"first");
      *(uint *)((long)pvVar4 + 0x100) = uVar2;
      uVar2 = parser_getuint(p,"weight");
      *(uint *)((long)pvVar4 + 0x104) = uVar2;
      wVar3 = parser_getuint(p,"books");
      pvVar5 = mem_zalloc((long)wVar3 << 5);
      *(void **)((long)pvVar4 + 0x110) = pvVar5;
      pVar1 = PARSE_ERROR_NONE;
      class_max_books = wVar3;
    }
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_class_magic(struct parser *p) {
	struct player_class *c = parser_priv(p);
	int num_books;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.books) {
		/* There's more than one magic directive for this class. */
		return PARSE_ERROR_REPEATED_DIRECTIVE;
	}
	c->magic.spell_first = parser_getuint(p, "first");
	c->magic.spell_weight = parser_getuint(p, "weight");
	num_books = parser_getuint(p, "books");
	c->magic.books = mem_zalloc(num_books * sizeof(struct class_book));
	class_max_books = num_books;
	return PARSE_ERROR_NONE;
}